

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

FloatTextureHandle
pbrt::FloatScaledTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  FloatConstantTexture *this;
  FloatImageTexture *pFVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *in_RDI;
  undefined8 in_R8;
  undefined1 auVar2 [64];
  Float FVar3;
  FloatImageTexture *imageCopy;
  FloatImageTexture *image;
  Float cs;
  FloatConstantTexture *cscale;
  int i;
  FloatTextureHandle scale;
  FloatTextureHandle tex;
  TextureEvalContext *this_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  TextureEvalContext in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  allocator<char> *fmt;
  int line;
  TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  file;
  LogLevel level;
  undefined8 local_100;
  char *in_stack_ffffffffffffff08;
  undefined4 uStack_f0;
  int in_stack_ffffffffffffff14;
  char *in_stack_ffffffffffffff18;
  undefined4 uStack_e0;
  LogLevel in_stack_ffffffffffffff24;
  undefined1 auStack_d8 [24];
  int local_ac;
  allocator<char> local_99;
  string local_98 [40];
  undefined8 local_70;
  allocator<char> local_51;
  string local_50 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  undefined8 local_10;
  
  file.bits = (uintptr_t)in_RDI;
  local_20 = in_RDX;
  local_10 = in_R8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffe78._56_8_);
  local_70 = local_10;
  TextureParameterDictionary::GetFloatTexture
            (in_stack_fffffffffffffe78._40_8_,in_stack_fffffffffffffe78._32_8_,
             in_stack_fffffffffffffe78.dpdy.super_Tuple3<pbrt::Vector3,_float>.y,
             in_stack_fffffffffffffe78._48_8_);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  fmt = &local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_20,in_stack_fffffffffffffeb8,in_stack_fffffffffffffe78._56_8_);
  TextureParameterDictionary::GetFloatTexture
            (in_stack_fffffffffffffe78._40_8_,in_stack_fffffffffffffe78._32_8_,
             in_stack_fffffffffffffe78.dpdy.super_Tuple3<pbrt::Vector3,_float>.y,
             in_stack_fffffffffffffe78._48_8_);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  local_ac = 0;
  args = local_20;
  do {
    auVar5 = in_stack_fffffffffffffe78._0_32_;
    if (1 < local_ac) {
      std::swap<pbrt::FloatTextureHandle>
                (in_stack_fffffffffffffe78._8_8_,
                 (FloatTextureHandle *)
                 in_stack_fffffffffffffe78.p.super_Tuple3<pbrt::Point3,_float>._0_8_);
      auVar4 = auVar5._0_16_;
      pstd::pmr::polymorphic_allocator<std::byte>::
      new_object<pbrt::FloatScaledTexture,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&>
                (auVar5._24_8_,auVar5._16_8_,auVar5._8_8_);
      FloatTextureHandle::TaggedPointer<pbrt::FloatScaledTexture>(auVar4._8_8_,auVar4._0_8_);
      return (FloatTextureHandle)
             (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              )file.bits;
    }
    this = TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
           ::CastOrNullptr<pbrt::FloatConstantTexture>
                     (in_stack_fffffffffffffe78.p.super_Tuple3<pbrt::Point3,_float>._0_8_);
    this_00 = in_stack_fffffffffffffe78._8_8_;
    if (this != (FloatConstantTexture *)0x0) {
      memset(&local_100,0,0x40);
      TextureEvalContext::TextureEvalContext(this_00);
      auVar2._8_8_ = in_stack_ffffffffffffff08;
      auVar2._0_8_ = local_100;
      auVar2._16_4_ = uStack_f0;
      auVar2._20_4_ = in_stack_ffffffffffffff14;
      auVar2._24_8_ = in_stack_ffffffffffffff18;
      auVar2._32_4_ = uStack_e0;
      auVar2._36_4_ = in_stack_ffffffffffffff24;
      auVar2._40_24_ = auStack_d8;
      auVar2 = vmovdqu64_avx512f(auVar2);
      in_stack_fffffffffffffe78 = (TextureEvalContext)vmovdqu64_avx512f(auVar2);
      FVar3 = FloatConstantTexture::Evaluate(this,in_stack_fffffffffffffe78);
      auVar4 = in_stack_fffffffffffffe78._0_16_;
      if ((FVar3 == 1.0) && (!NAN(FVar3))) {
        if (LOGGING_LogLevel < 1) {
          Log(in_stack_ffffffffffffff24,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
              in_stack_ffffffffffffff08);
        }
        FloatTextureHandle::FloatTextureHandle(auVar4._8_8_,auVar4._0_8_);
        return (FloatTextureHandle)
               (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                )file.bits;
      }
      pFVar1 = TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
               ::CastOrNullptr<pbrt::FloatImageTexture>
                         (in_stack_fffffffffffffe78.p.super_Tuple3<pbrt::Point3,_float>._0_8_);
      auVar4 = in_stack_fffffffffffffe78._0_16_;
      level = (LogLevel)((ulong)in_RDX >> 0x20);
      line = (int)((ulong)in_RDI >> 0x20);
      if (pFVar1 != (FloatImageTexture *)0x0) {
        pFVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
                 new_object<pbrt::FloatImageTexture,pbrt::FloatImageTexture&>
                           (in_stack_fffffffffffffe78.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_,
                            in_stack_fffffffffffffe78.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_)
        ;
        if (LOGGING_LogLevel < 1) {
          Log<float&>(level,(char *)file.bits,line,(char *)fmt,(float *)args);
        }
        (pFVar1->super_ImageTextureBase).scale = FVar3 * (pFVar1->super_ImageTextureBase).scale;
        FloatTextureHandle::TaggedPointer<pbrt::FloatImageTexture>(auVar4._8_8_,auVar4._0_8_);
        return (FloatTextureHandle)
               (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                )file.bits;
      }
    }
    std::swap<pbrt::FloatTextureHandle>
              (in_stack_fffffffffffffe78._8_8_,
               in_stack_fffffffffffffe78.p.super_Tuple3<pbrt::Point3,_float>._0_8_);
    local_ac = local_ac + 1;
  } while( true );
}

Assistant:

FloatTextureHandle FloatScaledTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    FloatTextureHandle tex = parameters.GetFloatTexture("tex", 1.f, alloc);
    FloatTextureHandle scale = parameters.GetFloatTexture("scale", 1.f, alloc);

    for (int i = 0; i < 2; ++i) {
        if (FloatConstantTexture *cscale = scale.CastOrNullptr<FloatConstantTexture>()) {
            Float cs = cscale->Evaluate({});
            if (cs == 1) {
                LOG_VERBOSE("Dropping useless scale by 1");
                return tex;
            } else if (FloatImageTexture *image =
                           tex.CastOrNullptr<FloatImageTexture>()) {
                FloatImageTexture *imageCopy =
                    alloc.new_object<FloatImageTexture>(*image);
                LOG_VERBOSE("Flattened scale %f * image texture", cs);
                imageCopy->scale *= cs;
                return imageCopy;
            }
#if defined(PBRT_BUILD_GPU_RENDERER)
            else if (GPUFloatImageTexture *gimage =
                         tex.CastOrNullptr<GPUFloatImageTexture>()) {
                GPUFloatImageTexture *gimageCopy =
                    alloc.new_object<GPUFloatImageTexture>(*gimage);
                LOG_VERBOSE("Flattened scale %f * gpu image texture", cs);
                gimageCopy->scale *= cs;
                return gimageCopy;
            }
#endif
        }
        std::swap(tex, scale);
    }

    std::swap(tex, scale);
    return alloc.new_object<FloatScaledTexture>(tex, scale);
}